

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urandom.cc
# Opt level: O1

void init_once(void)

{
  int iVar1;
  ssize_t sVar2;
  uint *puVar3;
  int *piVar4;
  long lVar5;
  uint in_ECX;
  ulong uVar6;
  int extraout_EDX;
  long lVar7;
  size_t len;
  uint8_t *out;
  uint8_t dummy;
  uint8_t local_11;
  
  out = &local_11;
  len = 1;
  sVar2 = boringssl_getrandom(out,1,1);
  if (sVar2 == -1) {
    puVar3 = (uint *)__errno_location();
    in_ECX = *puVar3;
    uVar6 = (ulong)in_ECX;
    if (in_ECX == 0xb) {
      urandom_fd = -3;
      return;
    }
    if (in_ECX == 0x26) {
      do {
        out = "/dev/urandom";
        len = 0x80000;
        iVar1 = open("/dev/urandom",0x80000);
        in_ECX = (uint)uVar6;
        if (iVar1 != -1) break;
      } while (*puVar3 == 4);
      if (-1 < iVar1) {
        urandom_fd = iVar1;
        return;
      }
      goto LAB_0014e789;
    }
  }
  else if (sVar2 == 1) {
    getrandom_ready = 1;
    urandom_fd = -3;
    return;
  }
  init_once();
LAB_0014e789:
  init_once();
  iVar1 = fill_with_entropy(out,len,1,in_ECX);
  if (iVar1 != 0) {
    return;
  }
  CRYPTO_sysrand_cold_1();
  if (len != 0) {
    CRYPTO_once(&rand_once,init_once);
    if (extraout_EDX != 0) {
      CRYPTO_once(&wait_for_entropy_once,wait_for_entropy);
    }
    piVar4 = __errno_location();
    *piVar4 = 0;
    do {
      if (len == 0) {
        return;
      }
      if (urandom_fd == -3) {
        lVar5 = boringssl_getrandom(out,len,(uint)(extraout_EDX == 0));
      }
      else {
        do {
          lVar5 = read(urandom_fd,out,len);
          if (lVar5 != -1) goto LAB_0014e840;
        } while (*piVar4 == 4);
        lVar5 = -1;
      }
LAB_0014e840:
      lVar7 = 0;
      if (0 < lVar5) {
        lVar7 = lVar5;
      }
      len = len - lVar7;
      out = out + lVar7;
    } while (0 < lVar5);
  }
  return;
}

Assistant:

static void init_once(void) {
#if defined(USE_NR_getrandom)
  int have_getrandom;
  uint8_t dummy;
  ssize_t getrandom_ret =
      boringssl_getrandom(&dummy, sizeof(dummy), GRND_NONBLOCK);
  if (getrandom_ret == 1) {
    getrandom_ready = 1;
    have_getrandom = 1;
  } else if (getrandom_ret == -1 && errno == EAGAIN) {
    // We have getrandom, but the entropy pool has not been initialized yet.
    have_getrandom = 1;
  } else if (getrandom_ret == -1 && errno == ENOSYS) {
    // Fallthrough to using /dev/urandom, below.
    have_getrandom = 0;
  } else {
    // Other errors are fatal.
    perror("getrandom");
    abort();
  }

  if (have_getrandom) {
    urandom_fd = kHaveGetrandom;
    maybe_set_extra_getrandom_flags();
    return;
  }
#endif  // USE_NR_getrandom

  // FIPS builds must support getrandom.
  //
  // Historically, only Android FIPS builds required getrandom, while Linux FIPS
  // builds had a /dev/urandom fallback which used RNDGETENTCNT as a poor
  // approximation for getrandom's blocking behavior. This is now removed, but
  // avoid making assumptions on this removal until March 2023, in case it needs
  // to be restored. This comment can be deleted after March 2023.
#if defined(BORINGSSL_FIPS)
  perror("getrandom not found");
  abort();
#endif

  int fd;
  do {
    fd = open("/dev/urandom", O_RDONLY | O_CLOEXEC);
  } while (fd == -1 && errno == EINTR);

  if (fd < 0) {
    perror("failed to open /dev/urandom");
    abort();
  }

  urandom_fd = fd;
}